

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_linked_definitions_section.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
::key(linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
      *this,string *k)

{
  bool bVar1;
  error_code eVar2;
  reference local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *k_local;
  linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
  *this_local;
  error_category *local_10;
  
  local_28 = k;
  k_local = (string *)this;
  bVar1 = std::operator==(k,"compilation");
  if (bVar1) {
    std::bitset<2UL>::operator[]((bitset<2UL> *)&local_38,(size_t)&this->seen_);
    std::bitset<2UL>::reference::operator=(&local_38,true);
    std::bitset<2UL>::reference::~reference(&local_38);
    eVar2 = rule::push<pstore::exchange::import_ns::string_rule,std::__cxx11::string*>
                      (&this->super_rule,&this->compilation_);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  else {
    bVar1 = std::operator==(local_28,"index");
    if (bVar1) {
      std::bitset<2UL>::operator[]((bitset<2UL> *)&local_48,(size_t)&this->seen_);
      std::bitset<2UL>::reference::operator=(&local_48,true);
      std::bitset<2UL>::reference::~reference(&local_48);
      eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                        (&this->super_rule,&this->index_);
      local_10 = eVar2._M_cat;
      this_local._0_4_ = eVar2._M_value;
    }
    else {
      std::error_code::error_code<pstore::exchange::import_ns::error,void>
                ((error_code *)&this_local,unrecognized_section_object_key);
    }
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code linked_definition<OutputIterator>::key (std::string const & k) {
                if (k == "compilation") {
                    seen_[compilation] = true;
                    return this->push<string_rule> (&compilation_);
                }
                if (k == "index") {
                    seen_[index] = true;
                    return this->push<uint64_rule> (&index_);
                }
                return error::unrecognized_section_object_key;
            }